

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyvalues.cpp
# Opt level: O3

float __thiscall KV::KeyValues::getValueAsFloat(KeyValues *this,float defaultVal)

{
  int iVar1;
  _Alloc_hider __nptr;
  int *piVar2;
  float fVar3;
  undefined1 auVar4 [12];
  char *local_28;
  
  if ((this->value).
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    __nptr._M_p = (this->value).
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_payload._M_value._M_dataplus._M_p;
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    *piVar2 = 0;
    fVar3 = strtof(__nptr._M_p,&local_28);
    if (local_28 == __nptr._M_p) {
      auVar4 = std::__throw_invalid_argument("stof");
      if (*piVar2 == 0) {
        *piVar2 = iVar1;
      }
      if (auVar4._8_4_ != 1) {
        _Unwind_Resume(auVar4._0_8_);
      }
      __cxa_begin_catch();
      __cxa_end_catch();
    }
    else {
      if (*piVar2 != 0) {
        if (*piVar2 != 0x22) {
          return fVar3;
        }
        fVar3 = (float)std::__throw_out_of_range("stof");
      }
      *piVar2 = iVar1;
      defaultVal = fVar3;
    }
  }
  return defaultVal;
}

Assistant:

float KeyValues::getValueAsFloat( float defaultVal /*= 0.0f*/ ) const
	{
		if ( !value )
			return defaultVal;

		try
		{
			return std::stof( value.value() );
		}
		catch ( const std::exception& )
		{
			return defaultVal;
		}
	}